

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.cpp
# Opt level: O0

int __thiscall CNetObjHandler::ValidateObj(CNetObjHandler *this,int Type,void *pData,int Size)

{
  bool bVar1;
  int in_ECX;
  int *in_RDX;
  undefined4 in_ESI;
  CNetObjHandler *in_RDI;
  CNetObj_GameDataRace *pObj_23;
  CNetObj_PlayerInfoRace *pObj_22;
  CNetEvent_Damage *pObj_21;
  CNetEvent_SoundWorld *pObj_20;
  CNetEvent_Death *pObj_19;
  CNetEvent_HammerHit *pObj_18;
  CNetEvent_Spawn *pObj_17;
  CNetEvent_Explosion *pObj_16;
  CNetEvent_Common *pObj_15;
  CNetObj_De_TuneParams *pObj_14;
  CNetObj_De_GameInfo *pObj_13;
  CNetObj_De_ClientInfo *pObj_12;
  CNetObj_SpectatorInfo *pObj_11;
  CNetObj_PlayerInfo *pObj_10;
  CNetObj_Character *pObj_9;
  CNetObj_CharacterCore *pObj_8;
  CNetObj_GameDataFlag *pObj_7;
  CNetObj_GameDataTeam *pObj_6;
  CNetObj_GameData *pObj_5;
  CNetObj_Flag *pObj_4;
  CNetObj_Pickup *pObj_3;
  CNetObj_Laser *pObj_2;
  CNetObj_Projectile *pObj_1;
  CNetObj_PlayerInput *pObj;
  int local_4;
  
  switch(in_ESI) {
  case 1:
    if (in_ECX == 0x28) {
      bVar1 = CheckInt(in_RDI,"m_Direction",*in_RDX,-1,1);
      if (bVar1) {
        bVar1 = CheckInt(in_RDI,"m_Jump",in_RDX[3],0,1);
        if (bVar1) {
          bVar1 = CheckInt(in_RDI,"m_Hook",in_RDX[5],0,1);
          if (bVar1) {
            bVar1 = CheckFlag(in_RDI,"m_PlayerFlags",in_RDX[6],0x7f);
            if (bVar1) {
              bVar1 = CheckInt(in_RDI,"m_WantedWeapon",in_RDX[7],0,5);
              if (bVar1) {
                local_4 = 0;
              }
              else {
                local_4 = -1;
              }
            }
            else {
              local_4 = -1;
            }
          }
          else {
            local_4 = -1;
          }
        }
        else {
          local_4 = -1;
        }
      }
      else {
        local_4 = -1;
      }
    }
    else {
      local_4 = -1;
    }
    break;
  case 2:
    if (in_ECX == 0x18) {
      bVar1 = CheckInt(in_RDI,"m_Type",in_RDX[4],0,5);
      if (bVar1) {
        bVar1 = CheckInt(in_RDI,"m_StartTick",in_RDX[5],0,0x7fffffff);
        if (bVar1) {
          local_4 = 0;
        }
        else {
          local_4 = -1;
        }
      }
      else {
        local_4 = -1;
      }
    }
    else {
      local_4 = -1;
    }
    break;
  case 3:
    if (in_ECX == 0x14) {
      bVar1 = CheckInt(in_RDI,"m_StartTick",in_RDX[4],0,0x7fffffff);
      if (bVar1) {
        local_4 = 0;
      }
      else {
        local_4 = -1;
      }
    }
    else {
      local_4 = -1;
    }
    break;
  case 4:
    if (in_ECX == 0xc) {
      bVar1 = CheckInt(in_RDI,"m_Type",in_RDX[2],0,7);
      if (bVar1) {
        local_4 = 0;
      }
      else {
        local_4 = -1;
      }
    }
    else {
      local_4 = -1;
    }
    break;
  case 5:
    if (in_ECX == 0xc) {
      bVar1 = CheckInt(in_RDI,"m_Team",in_RDX[2],0,1);
      if (bVar1) {
        local_4 = 0;
      }
      else {
        local_4 = -1;
      }
    }
    else {
      local_4 = -1;
    }
    break;
  case 6:
    if (in_ECX == 0xc) {
      bVar1 = CheckInt(in_RDI,"m_GameStartTick",*in_RDX,0,0x7fffffff);
      if (bVar1) {
        bVar1 = CheckFlag(in_RDI,"m_GameStateFlags",in_RDX[1],0x3f);
        if (bVar1) {
          bVar1 = CheckInt(in_RDI,"m_GameStateEndTick",in_RDX[2],0,0x7fffffff);
          if (bVar1) {
            local_4 = 0;
          }
          else {
            local_4 = -1;
          }
        }
        else {
          local_4 = -1;
        }
      }
      else {
        local_4 = -1;
      }
    }
    else {
      local_4 = -1;
    }
    break;
  case 7:
    if (in_ECX == 8) {
      local_4 = 0;
    }
    else {
      local_4 = -1;
    }
    break;
  case 8:
    if (in_ECX == 0x10) {
      bVar1 = CheckInt(in_RDI,"m_FlagCarrierRed",*in_RDX,-3,0x3f);
      if (bVar1) {
        bVar1 = CheckInt(in_RDI,"m_FlagCarrierBlue",in_RDX[1],-3,0x3f);
        if (bVar1) {
          bVar1 = CheckInt(in_RDI,"m_FlagDropTickRed",in_RDX[2],0,0x7fffffff);
          if (bVar1) {
            bVar1 = CheckInt(in_RDI,"m_FlagDropTickBlue",in_RDX[3],0,0x7fffffff);
            if (bVar1) {
              local_4 = 0;
            }
            else {
              local_4 = -1;
            }
          }
          else {
            local_4 = -1;
          }
        }
        else {
          local_4 = -1;
        }
      }
      else {
        local_4 = -1;
      }
    }
    else {
      local_4 = -1;
    }
    break;
  case 9:
    if (in_ECX == 0x3c) {
      bVar1 = CheckInt(in_RDI,"m_Tick",*in_RDX,0,0x7fffffff);
      if (bVar1) {
        bVar1 = CheckInt(in_RDI,"m_Direction",in_RDX[6],-1,1);
        if (bVar1) {
          bVar1 = CheckInt(in_RDI,"m_Jumped",in_RDX[7],0,3);
          if (bVar1) {
            bVar1 = CheckInt(in_RDI,"m_HookedPlayer",in_RDX[8],-1,0x3f);
            if (bVar1) {
              bVar1 = CheckInt(in_RDI,"m_HookState",in_RDX[9],-1,5);
              if (bVar1) {
                bVar1 = CheckInt(in_RDI,"m_HookTick",in_RDX[10],0,0x7fffffff);
                if (bVar1) {
                  local_4 = 0;
                }
                else {
                  local_4 = -1;
                }
              }
              else {
                local_4 = -1;
              }
            }
            else {
              local_4 = -1;
            }
          }
          else {
            local_4 = -1;
          }
        }
        else {
          local_4 = -1;
        }
      }
      else {
        local_4 = -1;
      }
    }
    else {
      local_4 = -1;
    }
    break;
  case 10:
    if (in_ECX == 0x58) {
      bVar1 = CheckInt(in_RDI,"m_Health",in_RDX[0xf],0,10);
      if (bVar1) {
        bVar1 = CheckInt(in_RDI,"m_Armor",in_RDX[0x10],0,10);
        if (bVar1) {
          bVar1 = CheckInt(in_RDI,"m_Weapon",in_RDX[0x12],0,5);
          if (bVar1) {
            bVar1 = CheckInt(in_RDI,"m_Emote",in_RDX[0x13],0,5);
            if (bVar1) {
              bVar1 = CheckInt(in_RDI,"m_AttackTick",in_RDX[0x14],0,0x7fffffff);
              if (bVar1) {
                bVar1 = CheckFlag(in_RDI,"m_TriggeredEvents",in_RDX[0x15],0x1f);
                if (bVar1) {
                  bVar1 = CheckInt(in_RDI,"m_Tick",*in_RDX,0,0x7fffffff);
                  if (bVar1) {
                    bVar1 = CheckInt(in_RDI,"m_Direction",in_RDX[6],-1,1);
                    if (bVar1) {
                      bVar1 = CheckInt(in_RDI,"m_Jumped",in_RDX[7],0,3);
                      if (bVar1) {
                        bVar1 = CheckInt(in_RDI,"m_HookedPlayer",in_RDX[8],-1,0x3f);
                        if (bVar1) {
                          bVar1 = CheckInt(in_RDI,"m_HookState",in_RDX[9],-1,5);
                          if (bVar1) {
                            bVar1 = CheckInt(in_RDI,"m_HookTick",in_RDX[10],0,0x7fffffff);
                            if (bVar1) {
                              local_4 = 0;
                            }
                            else {
                              local_4 = -1;
                            }
                          }
                          else {
                            local_4 = -1;
                          }
                        }
                        else {
                          local_4 = -1;
                        }
                      }
                      else {
                        local_4 = -1;
                      }
                    }
                    else {
                      local_4 = -1;
                    }
                  }
                  else {
                    local_4 = -1;
                  }
                }
                else {
                  local_4 = -1;
                }
              }
              else {
                local_4 = -1;
              }
            }
            else {
              local_4 = -1;
            }
          }
          else {
            local_4 = -1;
          }
        }
        else {
          local_4 = -1;
        }
      }
      else {
        local_4 = -1;
      }
    }
    else {
      local_4 = -1;
    }
    break;
  case 0xb:
    if (in_ECX == 0xc) {
      bVar1 = CheckFlag(in_RDI,"m_PlayerFlags",*in_RDX,0x7f);
      if (bVar1) {
        local_4 = 0;
      }
      else {
        local_4 = -1;
      }
    }
    else {
      local_4 = -1;
    }
    break;
  case 0xc:
    if (in_ECX == 0x10) {
      bVar1 = CheckInt(in_RDI,"m_SpecMode",*in_RDX,0,3);
      if (bVar1) {
        bVar1 = CheckInt(in_RDI,"m_SpectatorID",in_RDX[1],-1,0x3f);
        if (bVar1) {
          local_4 = 0;
        }
        else {
          local_4 = -1;
        }
      }
      else {
        local_4 = -1;
      }
    }
    else {
      local_4 = -1;
    }
    break;
  case 0xd:
    if (in_ECX == 0xe8) {
      bVar1 = CheckInt(in_RDI,"m_Local",*in_RDX,0,1);
      if (bVar1) {
        bVar1 = CheckInt(in_RDI,"m_Team",in_RDX[1],-1,1);
        if (bVar1) {
          bVar1 = CheckInt(in_RDI,"m_aUseCustomColors[0]",in_RDX[0x2e],0,1);
          if (bVar1) {
            bVar1 = CheckInt(in_RDI,"m_aUseCustomColors[1]",in_RDX[0x2f],0,1);
            if (bVar1) {
              bVar1 = CheckInt(in_RDI,"m_aUseCustomColors[2]",in_RDX[0x30],0,1);
              if (bVar1) {
                bVar1 = CheckInt(in_RDI,"m_aUseCustomColors[3]",in_RDX[0x31],0,1);
                if (bVar1) {
                  bVar1 = CheckInt(in_RDI,"m_aUseCustomColors[4]",in_RDX[0x32],0,1);
                  if (bVar1) {
                    bVar1 = CheckInt(in_RDI,"m_aUseCustomColors[5]",in_RDX[0x33],0,1);
                    if (bVar1) {
                      local_4 = 0;
                    }
                    else {
                      local_4 = -1;
                    }
                  }
                  else {
                    local_4 = -1;
                  }
                }
                else {
                  local_4 = -1;
                }
              }
              else {
                local_4 = -1;
              }
            }
            else {
              local_4 = -1;
            }
          }
          else {
            local_4 = -1;
          }
        }
        else {
          local_4 = -1;
        }
      }
      else {
        local_4 = -1;
      }
    }
    else {
      local_4 = -1;
    }
    break;
  case 0xe:
    if (in_ECX == 0x14) {
      bVar1 = CheckFlag(in_RDI,"m_GameFlags",*in_RDX,0xf);
      if (bVar1) {
        bVar1 = CheckInt(in_RDI,"m_ScoreLimit",in_RDX[1],0,0x7fffffff);
        if (bVar1) {
          bVar1 = CheckInt(in_RDI,"m_TimeLimit",in_RDX[2],0,0x7fffffff);
          if (bVar1) {
            bVar1 = CheckInt(in_RDI,"m_MatchNum",in_RDX[3],0,0x7fffffff);
            if (bVar1) {
              bVar1 = CheckInt(in_RDI,"m_MatchCurrent",in_RDX[4],0,0x7fffffff);
              if (bVar1) {
                local_4 = 0;
              }
              else {
                local_4 = -1;
              }
            }
            else {
              local_4 = -1;
            }
          }
          else {
            local_4 = -1;
          }
        }
        else {
          local_4 = -1;
        }
      }
      else {
        local_4 = -1;
      }
    }
    else {
      local_4 = -1;
    }
    break;
  case 0xf:
    if (in_ECX == 0x80) {
      local_4 = 0;
    }
    else {
      local_4 = -1;
    }
    break;
  case 0x10:
    if (in_ECX == 8) {
      local_4 = 0;
    }
    else {
      local_4 = -1;
    }
    break;
  case 0x11:
    if (in_ECX == 8) {
      local_4 = 0;
    }
    else {
      local_4 = -1;
    }
    break;
  case 0x12:
    if (in_ECX == 8) {
      local_4 = 0;
    }
    else {
      local_4 = -1;
    }
    break;
  case 0x13:
    if (in_ECX == 8) {
      local_4 = 0;
    }
    else {
      local_4 = -1;
    }
    break;
  case 0x14:
    if (in_ECX == 0xc) {
      bVar1 = CheckInt(in_RDI,"m_ClientID",in_RDX[2],0,0x3f);
      if (bVar1) {
        local_4 = 0;
      }
      else {
        local_4 = -1;
      }
    }
    else {
      local_4 = -1;
    }
    break;
  case 0x15:
    if (in_ECX == 0xc) {
      bVar1 = CheckInt(in_RDI,"m_SoundID",in_RDX[2],0,0x28);
      if (bVar1) {
        local_4 = 0;
      }
      else {
        local_4 = -1;
      }
    }
    else {
      local_4 = -1;
    }
    break;
  case 0x16:
    if (in_ECX == 0x1c) {
      bVar1 = CheckInt(in_RDI,"m_ClientID",in_RDX[2],0,0x3f);
      if (bVar1) {
        bVar1 = CheckInt(in_RDI,"m_HealthAmount",in_RDX[4],0,9);
        if (bVar1) {
          bVar1 = CheckInt(in_RDI,"m_ArmorAmount",in_RDX[5],0,9);
          if (bVar1) {
            bVar1 = CheckInt(in_RDI,"m_Self",in_RDX[6],0,1);
            if (bVar1) {
              local_4 = 0;
            }
            else {
              local_4 = -1;
            }
          }
          else {
            local_4 = -1;
          }
        }
        else {
          local_4 = -1;
        }
      }
      else {
        local_4 = -1;
      }
    }
    else {
      local_4 = -1;
    }
    break;
  case 0x17:
    if (in_ECX == 4) {
      bVar1 = CheckInt(in_RDI,"m_RaceStartTick",*in_RDX,0,0x7fffffff);
      if (bVar1) {
        local_4 = 0;
      }
      else {
        local_4 = -1;
      }
    }
    else {
      local_4 = -1;
    }
    break;
  case 0x18:
    if (in_ECX == 0xc) {
      bVar1 = CheckInt(in_RDI,"m_BestTime",*in_RDX,-1,0x7fffffff);
      if (bVar1) {
        bVar1 = CheckInt(in_RDI,"m_Precision",in_RDX[1],0,3);
        if (bVar1) {
          bVar1 = CheckFlag(in_RDI,"m_RaceFlags",in_RDX[2],7);
          if (bVar1) {
            local_4 = 0;
          }
          else {
            local_4 = -1;
          }
        }
        else {
          local_4 = -1;
        }
      }
      else {
        local_4 = -1;
      }
    }
    else {
      local_4 = -1;
    }
    break;
  default:
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int CNetObjHandler::ValidateObj(int Type, const void *pData, int Size)
{
	switch(Type)
	{
	case NETOBJTYPE_PLAYERINPUT:
	{
		const CNetObj_PlayerInput *pObj = (const CNetObj_PlayerInput *)pData;
		if(sizeof(*pObj) != Size) return -1;
		if(!CheckInt("m_Direction", pObj->m_Direction, -1, 1)) return -1;
		if(!CheckInt("m_Jump", pObj->m_Jump, 0, 1)) return -1;
		if(!CheckInt("m_Hook", pObj->m_Hook, 0, 1)) return -1;
		if(!CheckFlag("m_PlayerFlags", pObj->m_PlayerFlags, PLAYERFLAG_ADMIN|PLAYERFLAG_CHATTING|PLAYERFLAG_SCOREBOARD|PLAYERFLAG_READY|PLAYERFLAG_DEAD|PLAYERFLAG_WATCHING|PLAYERFLAG_BOT)) return -1;
		if(!CheckInt("m_WantedWeapon", pObj->m_WantedWeapon, 0, NUM_WEAPONS-1)) return -1;
		return 0;
	}
	
	case NETOBJTYPE_PROJECTILE:
	{
		const CNetObj_Projectile *pObj = (const CNetObj_Projectile *)pData;
		if(sizeof(*pObj) != Size) return -1;
		if(!CheckInt("m_Type", pObj->m_Type, 0, NUM_WEAPONS-1)) return -1;
		if(!CheckInt("m_StartTick", pObj->m_StartTick, 0, max_int)) return -1;
		return 0;
	}
	
	case NETOBJTYPE_LASER:
	{
		const CNetObj_Laser *pObj = (const CNetObj_Laser *)pData;
		if(sizeof(*pObj) != Size) return -1;
		if(!CheckInt("m_StartTick", pObj->m_StartTick, 0, max_int)) return -1;
		return 0;
	}
	
	case NETOBJTYPE_PICKUP:
	{
		const CNetObj_Pickup *pObj = (const CNetObj_Pickup *)pData;
		if(sizeof(*pObj) != Size) return -1;
		if(!CheckInt("m_Type", pObj->m_Type, 0, 7)) return -1;
		return 0;
	}
	
	case NETOBJTYPE_FLAG:
	{
		const CNetObj_Flag *pObj = (const CNetObj_Flag *)pData;
		if(sizeof(*pObj) != Size) return -1;
		if(!CheckInt("m_Team", pObj->m_Team, TEAM_RED, TEAM_BLUE)) return -1;
		return 0;
	}
	
	case NETOBJTYPE_GAMEDATA:
	{
		const CNetObj_GameData *pObj = (const CNetObj_GameData *)pData;
		if(sizeof(*pObj) != Size) return -1;
		if(!CheckInt("m_GameStartTick", pObj->m_GameStartTick, 0, max_int)) return -1;
		if(!CheckFlag("m_GameStateFlags", pObj->m_GameStateFlags, GAMESTATEFLAG_WARMUP|GAMESTATEFLAG_SUDDENDEATH|GAMESTATEFLAG_ROUNDOVER|GAMESTATEFLAG_GAMEOVER|GAMESTATEFLAG_PAUSED|GAMESTATEFLAG_STARTCOUNTDOWN)) return -1;
		if(!CheckInt("m_GameStateEndTick", pObj->m_GameStateEndTick, 0, max_int)) return -1;
		return 0;
	}
	
	case NETOBJTYPE_GAMEDATATEAM:
	{
		const CNetObj_GameDataTeam *pObj = (const CNetObj_GameDataTeam *)pData;
		if(sizeof(*pObj) != Size) return -1;
		return 0;
	}
	
	case NETOBJTYPE_GAMEDATAFLAG:
	{
		const CNetObj_GameDataFlag *pObj = (const CNetObj_GameDataFlag *)pData;
		if(sizeof(*pObj) != Size) return -1;
		if(!CheckInt("m_FlagCarrierRed", pObj->m_FlagCarrierRed, FLAG_MISSING, MAX_CLIENTS-1)) return -1;
		if(!CheckInt("m_FlagCarrierBlue", pObj->m_FlagCarrierBlue, FLAG_MISSING, MAX_CLIENTS-1)) return -1;
		if(!CheckInt("m_FlagDropTickRed", pObj->m_FlagDropTickRed, 0, max_int)) return -1;
		if(!CheckInt("m_FlagDropTickBlue", pObj->m_FlagDropTickBlue, 0, max_int)) return -1;
		return 0;
	}
	
	case NETOBJTYPE_CHARACTERCORE:
	{
		const CNetObj_CharacterCore *pObj = (const CNetObj_CharacterCore *)pData;
		if(sizeof(*pObj) != Size) return -1;
		if(!CheckInt("m_Tick", pObj->m_Tick, 0, max_int)) return -1;
		if(!CheckInt("m_Direction", pObj->m_Direction, -1, 1)) return -1;
		if(!CheckInt("m_Jumped", pObj->m_Jumped, 0, 3)) return -1;
		if(!CheckInt("m_HookedPlayer", pObj->m_HookedPlayer, -1, MAX_CLIENTS-1)) return -1;
		if(!CheckInt("m_HookState", pObj->m_HookState, -1, 5)) return -1;
		if(!CheckInt("m_HookTick", pObj->m_HookTick, 0, max_int)) return -1;
		return 0;
	}
	
	case NETOBJTYPE_CHARACTER:
	{
		const CNetObj_Character *pObj = (const CNetObj_Character *)pData;
		if(sizeof(*pObj) != Size) return -1;
		if(!CheckInt("m_Health", pObj->m_Health, 0, 10)) return -1;
		if(!CheckInt("m_Armor", pObj->m_Armor, 0, 10)) return -1;
		if(!CheckInt("m_Weapon", pObj->m_Weapon, 0, NUM_WEAPONS-1)) return -1;
		if(!CheckInt("m_Emote", pObj->m_Emote, 0, 5)) return -1;
		if(!CheckInt("m_AttackTick", pObj->m_AttackTick, 0, max_int)) return -1;
		if(!CheckFlag("m_TriggeredEvents", pObj->m_TriggeredEvents, COREEVENTFLAG_GROUND_JUMP|COREEVENTFLAG_AIR_JUMP|COREEVENTFLAG_HOOK_ATTACH_PLAYER|COREEVENTFLAG_HOOK_ATTACH_GROUND|COREEVENTFLAG_HOOK_HIT_NOHOOK)) return -1;
		if(!CheckInt("m_Tick", pObj->m_Tick, 0, max_int)) return -1;
		if(!CheckInt("m_Direction", pObj->m_Direction, -1, 1)) return -1;
		if(!CheckInt("m_Jumped", pObj->m_Jumped, 0, 3)) return -1;
		if(!CheckInt("m_HookedPlayer", pObj->m_HookedPlayer, -1, MAX_CLIENTS-1)) return -1;
		if(!CheckInt("m_HookState", pObj->m_HookState, -1, 5)) return -1;
		if(!CheckInt("m_HookTick", pObj->m_HookTick, 0, max_int)) return -1;
		return 0;
	}
	
	case NETOBJTYPE_PLAYERINFO:
	{
		const CNetObj_PlayerInfo *pObj = (const CNetObj_PlayerInfo *)pData;
		if(sizeof(*pObj) != Size) return -1;
		if(!CheckFlag("m_PlayerFlags", pObj->m_PlayerFlags, PLAYERFLAG_ADMIN|PLAYERFLAG_CHATTING|PLAYERFLAG_SCOREBOARD|PLAYERFLAG_READY|PLAYERFLAG_DEAD|PLAYERFLAG_WATCHING|PLAYERFLAG_BOT)) return -1;
		return 0;
	}
	
	case NETOBJTYPE_SPECTATORINFO:
	{
		const CNetObj_SpectatorInfo *pObj = (const CNetObj_SpectatorInfo *)pData;
		if(sizeof(*pObj) != Size) return -1;
		if(!CheckInt("m_SpecMode", pObj->m_SpecMode, 0, NUM_SPECMODES-1)) return -1;
		if(!CheckInt("m_SpectatorID", pObj->m_SpectatorID, -1, MAX_CLIENTS-1)) return -1;
		return 0;
	}
	
	case NETOBJTYPE_DE_CLIENTINFO:
	{
		const CNetObj_De_ClientInfo *pObj = (const CNetObj_De_ClientInfo *)pData;
		if(sizeof(*pObj) != Size) return -1;
		if(!CheckInt("m_Local", pObj->m_Local, 0, 1)) return -1;
		if(!CheckInt("m_Team", pObj->m_Team, TEAM_SPECTATORS, TEAM_BLUE)) return -1;
		if(!CheckInt("m_aUseCustomColors[0]", pObj->m_aUseCustomColors[0], 0, 1)) return -1;
		if(!CheckInt("m_aUseCustomColors[1]", pObj->m_aUseCustomColors[1], 0, 1)) return -1;
		if(!CheckInt("m_aUseCustomColors[2]", pObj->m_aUseCustomColors[2], 0, 1)) return -1;
		if(!CheckInt("m_aUseCustomColors[3]", pObj->m_aUseCustomColors[3], 0, 1)) return -1;
		if(!CheckInt("m_aUseCustomColors[4]", pObj->m_aUseCustomColors[4], 0, 1)) return -1;
		if(!CheckInt("m_aUseCustomColors[5]", pObj->m_aUseCustomColors[5], 0, 1)) return -1;
		return 0;
	}
	
	case NETOBJTYPE_DE_GAMEINFO:
	{
		const CNetObj_De_GameInfo *pObj = (const CNetObj_De_GameInfo *)pData;
		if(sizeof(*pObj) != Size) return -1;
		if(!CheckFlag("m_GameFlags", pObj->m_GameFlags, GAMEFLAG_TEAMS|GAMEFLAG_FLAGS|GAMEFLAG_SURVIVAL|GAMEFLAG_RACE)) return -1;
		if(!CheckInt("m_ScoreLimit", pObj->m_ScoreLimit, 0, max_int)) return -1;
		if(!CheckInt("m_TimeLimit", pObj->m_TimeLimit, 0, max_int)) return -1;
		if(!CheckInt("m_MatchNum", pObj->m_MatchNum, 0, max_int)) return -1;
		if(!CheckInt("m_MatchCurrent", pObj->m_MatchCurrent, 0, max_int)) return -1;
		return 0;
	}
	
	case NETOBJTYPE_DE_TUNEPARAMS:
	{
		const CNetObj_De_TuneParams *pObj = (const CNetObj_De_TuneParams *)pData;
		if(sizeof(*pObj) != Size) return -1;
		return 0;
	}
	
	case NETEVENTTYPE_COMMON:
	{
		const CNetEvent_Common *pObj = (const CNetEvent_Common *)pData;
		if(sizeof(*pObj) != Size) return -1;
		return 0;
	}
	
	case NETEVENTTYPE_EXPLOSION:
	{
		const CNetEvent_Explosion *pObj = (const CNetEvent_Explosion *)pData;
		if(sizeof(*pObj) != Size) return -1;
		return 0;
	}
	
	case NETEVENTTYPE_SPAWN:
	{
		const CNetEvent_Spawn *pObj = (const CNetEvent_Spawn *)pData;
		if(sizeof(*pObj) != Size) return -1;
		return 0;
	}
	
	case NETEVENTTYPE_HAMMERHIT:
	{
		const CNetEvent_HammerHit *pObj = (const CNetEvent_HammerHit *)pData;
		if(sizeof(*pObj) != Size) return -1;
		return 0;
	}
	
	case NETEVENTTYPE_DEATH:
	{
		const CNetEvent_Death *pObj = (const CNetEvent_Death *)pData;
		if(sizeof(*pObj) != Size) return -1;
		if(!CheckInt("m_ClientID", pObj->m_ClientID, 0, MAX_CLIENTS-1)) return -1;
		return 0;
	}
	
	case NETEVENTTYPE_SOUNDWORLD:
	{
		const CNetEvent_SoundWorld *pObj = (const CNetEvent_SoundWorld *)pData;
		if(sizeof(*pObj) != Size) return -1;
		if(!CheckInt("m_SoundID", pObj->m_SoundID, 0, NUM_SOUNDS-1)) return -1;
		return 0;
	}
	
	case NETEVENTTYPE_DAMAGE:
	{
		const CNetEvent_Damage *pObj = (const CNetEvent_Damage *)pData;
		if(sizeof(*pObj) != Size) return -1;
		if(!CheckInt("m_ClientID", pObj->m_ClientID, 0, MAX_CLIENTS-1)) return -1;
		if(!CheckInt("m_HealthAmount", pObj->m_HealthAmount, 0, 9)) return -1;
		if(!CheckInt("m_ArmorAmount", pObj->m_ArmorAmount, 0, 9)) return -1;
		if(!CheckInt("m_Self", pObj->m_Self, 0, 1)) return -1;
		return 0;
	}
	
	case NETOBJTYPE_PLAYERINFORACE:
	{
		const CNetObj_PlayerInfoRace *pObj = (const CNetObj_PlayerInfoRace *)pData;
		if(sizeof(*pObj) != Size) return -1;
		if(!CheckInt("m_RaceStartTick", pObj->m_RaceStartTick, 0, max_int)) return -1;
		return 0;
	}
	
	case NETOBJTYPE_GAMEDATARACE:
	{
		const CNetObj_GameDataRace *pObj = (const CNetObj_GameDataRace *)pData;
		if(sizeof(*pObj) != Size) return -1;
		if(!CheckInt("m_BestTime", pObj->m_BestTime, -1, max_int)) return -1;
		if(!CheckInt("m_Precision", pObj->m_Precision, 0, 3)) return -1;
		if(!CheckFlag("m_RaceFlags", pObj->m_RaceFlags, RACEFLAG_HIDE_KILLMSG|RACEFLAG_FINISHMSG_AS_CHAT|RACEFLAG_KEEP_WANTED_WEAPON)) return -1;
		return 0;
	}
	
	}
	return -1;
}